

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  TestInfo *pTVar1;
  InternalRunDeathTestFlag *pIVar2;
  bool bVar3;
  int iVar4;
  __pid_t _Var5;
  uint uVar6;
  UnitTestImpl *pUVar7;
  void *__addr;
  int *piVar8;
  long lVar9;
  size_t __len;
  allocator<char> local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  int pipe_fd [2];
  int death_test_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  Arguments args;
  string local_1d8;
  ExecDeathTestArgs args_1;
  sigaction saved_sigprof_action;
  sigaction ignore_sigprof_action;
  string internal_flag;
  string filter_flag;
  
  pUVar7 = GetUnitTestImpl();
  pTVar1 = pUVar7->current_test_info_;
  pIVar2 = (pUVar7->internal_run_death_test_flag_).ptr_;
  death_test_index = (pTVar1->result_).death_test_count_;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar2->write_fd_;
    return EXECUTE_TEST;
  }
  do {
    iVar4 = pipe(pipe_fd);
    bVar3 = IsTrue(iVar4 != -1);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_308,"CHECK failed: File ",(allocator<char> *)&local_248);
      std::operator+(&local_2e8,&local_308,
                     "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/contrib/gtest-1.7.0/src/gtest-death-test.cc"
                    );
      std::operator+(&local_2c8,&local_2e8,", line ");
      local_268._M_dataplus._M_p._0_4_ = 0x459;
      StreamableToString<int>(&local_288,(int *)&local_268);
      std::operator+(&local_2a8,&local_2c8,&local_288);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ignore_sigprof_action,&local_2a8,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &saved_sigprof_action,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ignore_sigprof_action,"pipe(pipe_fd) != -1");
      DeathTestAbort((string *)&saved_sigprof_action);
      goto LAB_00117cbd;
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  do {
    iVar4 = fcntl(pipe_fd[1],2,0);
    bVar3 = IsTrue(iVar4 != -1);
    if (!bVar3) {
LAB_00117cbd:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_308,"CHECK failed: File ",(allocator<char> *)&local_248);
      std::operator+(&local_2e8,&local_308,
                     "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/contrib/gtest-1.7.0/src/gtest-death-test.cc"
                    );
      std::operator+(&local_2c8,&local_2e8,", line ");
      local_268._M_dataplus._M_p._0_4_ = 0x45c;
      StreamableToString<int>(&local_288,(int *)&local_268);
      std::operator+(&local_2a8,&local_2c8,&local_288);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ignore_sigprof_action,&local_2a8,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &saved_sigprof_action,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ignore_sigprof_action,"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
      DeathTestAbort((string *)&saved_sigprof_action);
      goto LAB_00117d76;
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"--",(allocator<char> *)&local_288);
  std::operator+(&local_2e8,&local_308,"gtest_");
  std::operator+(&local_2c8,&local_2e8,"filter");
  std::operator+(&local_2a8,&local_2c8,"=");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action,&local_2a8,(pTVar1->test_case_name_)._M_dataplus._M_p);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &saved_sigprof_action,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action,".");
  std::operator+(&filter_flag,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &saved_sigprof_action,(pTVar1->name_)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&saved_sigprof_action);
  std::__cxx11::string::~string((string *)&ignore_sigprof_action);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"--",&local_309);
  std::operator+(&local_248,&local_218,"gtest_");
  std::operator+(&local_268,&local_248,"internal_run_death_test");
  std::operator+(&local_288,&local_268,"=");
  std::operator+(&local_308,&local_288,this->file_);
  std::operator+(&local_2e8,&local_308,"|");
  StreamableToString<int>((string *)&args,&this->line_);
  std::operator+(&local_2c8,&local_2e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args);
  std::operator+(&local_2a8,&local_2c8,"|");
  StreamableToString<int>((string *)&args_1,&death_test_index);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action,&local_2a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &saved_sigprof_action,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action,"|");
  StreamableToString<int>(&local_1d8,pipe_fd + 1);
  std::operator+(&internal_flag,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &saved_sigprof_action,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&saved_sigprof_action);
  std::__cxx11::string::~string((string *)&ignore_sigprof_action);
  std::__cxx11::string::~string((string *)&args_1);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&args);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_218);
  Arguments::Arguments(&args);
  GetArgvsForDeathTestChildProcess_abi_cxx11_();
  Arguments::AddArguments<std::__cxx11::string>
            (&args,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&saved_sigprof_action);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&saved_sigprof_action);
  Arguments::AddArgument(&args,filter_flag._M_dataplus._M_p);
  Arguments::AddArgument(&args,internal_flag._M_dataplus._M_p);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&saved_sigprof_action,"",(allocator<char> *)&ignore_sigprof_action);
  DeathTest::set_last_death_test_message((string *)&saved_sigprof_action);
  std::__cxx11::string::~string((string *)&saved_sigprof_action);
  CaptureStderr();
  FlushInfoLog();
  args_1.argv = args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  args_1.close_fd = pipe_fd[0];
  memset((sigaction *)&ignore_sigprof_action,0,0x98);
  sigemptyset((sigset_t *)&ignore_sigprof_action.sa_mask);
  ignore_sigprof_action.__sigaction_handler = (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
  do {
    while (iVar4 = sigaction(0x1b,(sigaction *)&ignore_sigprof_action,
                             (sigaction *)&saved_sigprof_action), iVar4 == -1) {
      piVar8 = __errno_location();
      if (*piVar8 != 4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_248,"CHECK failed: File ",&local_309);
        std::operator+(&local_268,&local_248,
                       "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/contrib/gtest-1.7.0/src/gtest-death-test.cc"
                      );
        std::operator+(&local_288,&local_268,", line ");
        local_1d8._M_dataplus._M_p._0_4_ = 0x417;
        StreamableToString<int>(&local_218,(int *)&local_1d8);
        std::operator+(&local_308,&local_288,&local_218);
        std::operator+(&local_2e8,&local_308,": ");
        std::operator+(&local_2c8,&local_2e8,
                       "sigaction( SIGPROF, &ignore_sigprof_action, &saved_sigprof_action)");
        std::operator+(&local_2a8,&local_2c8," != -1");
        DeathTestAbort(&local_2a8);
        goto LAB_0011796a;
      }
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
LAB_0011796a:
  if (FLAGS_gtest_death_test_use_fork != '\0') {
    _Var5 = fork();
    if (_Var5 != 0) goto LAB_00117a69;
    ExecDeathTestChildMain(&args_1);
  }
  if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') goto LAB_0011812f;
LAB_0011799d:
  uVar6 = getpagesize();
  __len = (size_t)(int)uVar6;
  __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
  do {
    bVar3 = IsTrue(__addr != (void *)0xffffffffffffffff);
    if (!bVar3) goto LAB_00117f04;
    bVar3 = AlwaysFalse();
  } while (bVar3);
  lVar9 = 0;
  if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
    lVar9 = __len - 0x40;
  }
  do {
    bVar3 = IsTrue(((ulong)((long)__addr + lVar9) & 0x3f) == 0 && 0x40 < uVar6);
    if (!bVar3) goto LAB_00117fbd;
    bVar3 = AlwaysFalse();
  } while (bVar3);
  _Var5 = clone(ExecDeathTestChildMain,(void *)((long)__addr + lVar9),0x11,&args_1);
  do {
    iVar4 = munmap(__addr,__len);
    bVar3 = IsTrue(iVar4 != -1);
    if (!bVar3) goto LAB_00118076;
    bVar3 = AlwaysFalse();
  } while (bVar3);
LAB_00117a69:
  do {
    while (iVar4 = sigaction(0x1b,(sigaction *)&saved_sigprof_action,(sigaction *)0x0), iVar4 == -1)
    {
      piVar8 = __errno_location();
      if (*piVar8 != 4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_248,"CHECK failed: File ",&local_309);
        std::operator+(&local_268,&local_248,
                       "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/contrib/gtest-1.7.0/src/gtest-death-test.cc"
                      );
        std::operator+(&local_288,&local_268,", line ");
        local_1d8._M_dataplus._M_p._0_4_ = 0x441;
        StreamableToString<int>(&local_218,(int *)&local_1d8);
        std::operator+(&local_308,&local_288,&local_218);
        std::operator+(&local_2e8,&local_308,": ");
        std::operator+(&local_2c8,&local_2e8,"sigaction(SIGPROF, &saved_sigprof_action, NULL)");
        std::operator+(&local_2a8,&local_2c8," != -1");
        DeathTestAbort(&local_2a8);
        goto LAB_00117b71;
      }
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
LAB_00117b71:
  do {
    bVar3 = IsTrue(_Var5 != -1);
    if (!bVar3) goto LAB_00117d76;
    bVar3 = AlwaysFalse();
  } while (bVar3);
  do {
    while (iVar4 = close(pipe_fd[1]), iVar4 != -1) {
      bVar3 = AlwaysFalse();
      if (!bVar3) {
        *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = _Var5;
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = pipe_fd[0];
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        Arguments::~Arguments(&args);
        std::__cxx11::string::~string((string *)&internal_flag);
        std::__cxx11::string::~string((string *)&filter_flag);
        return OVERSEE_TEST;
      }
    }
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  goto LAB_00117e2f;
LAB_00117d76:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"CHECK failed: File ",(allocator<char> *)&local_1d8);
  std::operator+(&local_288,&local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/contrib/gtest-1.7.0/src/gtest-death-test.cc"
                );
  std::operator+(&local_308,&local_288,", line ");
  local_218._M_dataplus._M_p._0_4_ = 0x444;
  StreamableToString<int>(&local_248,(int *)&local_218);
  std::operator+(&local_2e8,&local_308,&local_248);
  std::operator+(&local_2c8,&local_2e8,": ");
  std::operator+(&local_2a8,&local_2c8,"child_pid != -1");
  DeathTestAbort(&local_2a8);
LAB_00117e2f:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"CHECK failed: File ",(allocator<char> *)&local_218);
  std::operator+(&local_308,&local_288,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/contrib/gtest-1.7.0/src/gtest-death-test.cc"
                );
  std::operator+(&local_2e8,&local_308,", line ");
  local_248._M_dataplus._M_p._0_4_ = 0x473;
  StreamableToString<int>(&local_268,(int *)&local_248);
  std::operator+(&local_2c8,&local_2e8,&local_268);
  std::operator+(&local_2a8,&local_2c8,": ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action,&local_2a8,"close(pipe_fd[1])");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &saved_sigprof_action,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action," != -1");
  DeathTestAbort((string *)&saved_sigprof_action);
LAB_00117f04:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"CHECK failed: File ",(allocator<char> *)&local_1d8);
  std::operator+(&local_288,&local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/contrib/gtest-1.7.0/src/gtest-death-test.cc"
                );
  std::operator+(&local_308,&local_288,", line ");
  local_218._M_dataplus._M_p._0_4_ = 0x423;
  StreamableToString<int>(&local_248,(int *)&local_218);
  std::operator+(&local_2e8,&local_308,&local_248);
  std::operator+(&local_2c8,&local_2e8,": ");
  std::operator+(&local_2a8,&local_2c8,"stack != MAP_FAILED");
  DeathTestAbort(&local_2a8);
LAB_00117fbd:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"CHECK failed: File ",(allocator<char> *)&local_1d8);
  std::operator+(&local_288,&local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/contrib/gtest-1.7.0/src/gtest-death-test.cc"
                );
  std::operator+(&local_308,&local_288,", line ");
  local_218._M_dataplus._M_p._0_4_ = 0x430;
  StreamableToString<int>(&local_248,(int *)&local_218);
  std::operator+(&local_2e8,&local_308,&local_248);
  std::operator+(&local_2c8,&local_2e8,": ");
  std::operator+(&local_2a8,&local_2c8,
                 "stack_size > kMaxStackAlignment && reinterpret_cast<intptr_t>(stack_top) % kMaxStackAlignment == 0"
                );
  DeathTestAbort(&local_2a8);
LAB_00118076:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"CHECK failed: File ",(allocator<char> *)&local_1d8);
  std::operator+(&local_288,&local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/contrib/gtest-1.7.0/src/gtest-death-test.cc"
                );
  std::operator+(&local_308,&local_288,", line ");
  local_218._M_dataplus._M_p._0_4_ = 0x434;
  StreamableToString<int>(&local_248,(int *)&local_218);
  std::operator+(&local_2e8,&local_308,&local_248);
  std::operator+(&local_2c8,&local_2e8,": ");
  std::operator+(&local_2a8,&local_2c8,"munmap(stack, stack_size) != -1");
  DeathTestAbort(&local_2a8);
LAB_0011812f:
  iVar4 = __cxa_guard_acquire();
  if (iVar4 != 0) {
    ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down = StackGrowsDown();
    __cxa_guard_release();
  }
  goto LAB_0011799d;
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kFilterFlag + "="
      + info->test_case_name() + "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}